

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cc
# Opt level: O0

Var * __thiscall kratos::Generator::var(Generator *this,Var *v,string *var_name)

{
  bool bVar1;
  uint32_t width;
  uint uVar2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *size;
  Var *this_00;
  Var *v_;
  string *var_name_local;
  Var *v_local;
  Generator *this_local;
  
  width = Var::var_width(v);
  size = Var::size(v);
  bVar1 = Var::is_signed(v);
  this_00 = var(this,var_name,width,size,bVar1);
  bVar1 = Var::explicit_array(v);
  Var::set_explicit_array(this_00,bVar1);
  uVar2 = (*(v->super_IRNode)._vptr_IRNode[0x18])();
  (*(this_00->super_IRNode)._vptr_IRNode[0x19])(this_00,(ulong)(uVar2 & 1));
  Var::copy_meta_data(this_00,this_00,true);
  return this_00;
}

Assistant:

Var &Generator::var(const Var &v, const std::string &var_name) {
    auto &v_ = var(var_name, v.var_width(), v.size(), v.is_signed());
    v_.set_explicit_array(v.explicit_array());
    v_.set_is_packed(v.is_packed());
    // need to copy other definition over
    v_.copy_meta_data(&v_, true);
    return v_;
}